

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

uint64_t __thiscall
capnp::compiler::Compiler::Impl::addNode(Impl *this,uint64_t desiredId,Node *node)

{
  Node *this_00;
  undefined8 this_01;
  pointer ppVar1;
  char (*in_R8) [23];
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_Node_*>_&&>::value,_pair<iterator,_bool>_>
  _Var2;
  CappedArray<char,_17UL> local_f8;
  String local_d8;
  ArrayPtr<const_char> local_c0 [2];
  CappedArray<char,_17UL> local_a0;
  String local_80;
  ArrayPtr<const_char> local_68;
  _Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
  local_58;
  undefined1 local_50;
  Node *local_48;
  pair<unsigned_long,_capnp::compiler::Compiler::Node_*> local_40;
  _Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
  local_30;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_long,_Node_*>_&&>::value,_pair<iterator,_bool>_>
  insertResult;
  Node *node_local;
  uint64_t desiredId_local;
  Impl *this_local;
  
  insertResult._8_8_ = node;
  node_local = (Node *)desiredId;
  desiredId_local = (uint64_t)this;
  while( true ) {
    local_48 = (Node *)insertResult._8_8_;
    local_40 = std::make_pair<unsigned_long&,capnp::compiler::Compiler::Node*>
                         ((unsigned_long *)&node_local,&local_48);
    _Var2 = std::
            unordered_map<unsigned_long,capnp::compiler::Compiler::Node*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>>
            ::insert<std::pair<unsigned_long,capnp::compiler::Compiler::Node*>>
                      ((unordered_map<unsigned_long,capnp::compiler::Compiler::Node*,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,capnp::compiler::Compiler::Node*>>>
                        *)&this->nodesById,&local_40);
    this_01 = insertResult._8_8_;
    local_58._M_cur =
         (__node_type *)
         _Var2.first.
         super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
         ._M_cur;
    local_50 = _Var2.second;
    if (((undefined1  [16])_Var2 & (undefined1  [16])0x1) != (undefined1  [16])0x0) break;
    local_30._M_cur = local_58._M_cur;
    insertResult.first.
    super__Node_iterator_base<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false>
    ._M_cur._0_1_ = local_50;
    if (((ulong)node_local & 0x8000000000000000) != 0) {
      kj::hex(&local_a0,(unsigned_long)node_local);
      kj::str<char_const(&)[17],kj::CappedArray<char,17ul>,char_const(&)[2]>
                (&local_80,(kj *)"Duplicate ID @0x",(char (*) [17])&local_a0,
                 (CappedArray<char,_17UL> *)0xad0330,(char (*) [2])in_R8);
      kj::StringPtr::StringPtr((StringPtr *)&local_68,&local_80);
      Node::addError((Node *)this_01,(StringPtr)local_68);
      kj::String::~String(&local_80);
      ppVar1 = std::__detail::
               _Node_iterator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_long,_capnp::compiler::Compiler::Node_*>,_false,_false>
                             *)&local_30);
      this_00 = ppVar1->second;
      kj::hex(&local_f8,(unsigned_long)node_local);
      kj::str<char_const(&)[7],kj::CappedArray<char,17ul>,char_const(&)[23]>
                (&local_d8,(kj *)0xabfddd,(char (*) [7])&local_f8,
                 (CappedArray<char,_17UL> *)" originally used here.",in_R8);
      kj::StringPtr::StringPtr((StringPtr *)local_c0,&local_d8);
      Node::addError(this_00,(StringPtr)local_c0[0]);
      kj::String::~String(&local_d8);
    }
    node_local = (Node *)this->nextBogusId;
    this->nextBogusId = (uint64_t)((long)&(node_local->super_Resolver)._vptr_Resolver + 1);
  }
  return (uint64_t)node_local;
}

Assistant:

uint64_t Compiler::Impl::addNode(uint64_t desiredId, Node& node) {
  for (;;) {
    auto insertResult = nodesById.insert(std::make_pair(desiredId, &node));
    if (insertResult.second) {
      return desiredId;
    }

    // Only report an error if this ID is not bogus.  Actual IDs specified in the original source
    // code are required to have the upper bit set.  Anything else must have been manufactured
    // at some point to cover up an error.
    if (desiredId & (1ull << 63)) {
      node.addError(kj::str("Duplicate ID @0x", kj::hex(desiredId), "."));
      insertResult.first->second->addError(
          kj::str("ID @0x", kj::hex(desiredId), " originally used here."));
    }

    // Assign a new bogus ID.
    desiredId = nextBogusId++;
  }
}